

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void ossl_close(ssl_connect_data *connssl)

{
  SSL *s;
  SSL_CTX *pSVar1;
  
  s = (SSL *)connssl->backend->handle;
  if (s != (SSL *)0x0) {
    SSL_shutdown(s);
    SSL_set_connect_state((SSL *)connssl->backend->handle);
    SSL_free((SSL *)connssl->backend->handle);
    connssl->backend->handle = (SSL *)0x0;
  }
  pSVar1 = (SSL_CTX *)connssl->backend->ctx;
  if (pSVar1 != (SSL_CTX *)0x0) {
    SSL_CTX_free(pSVar1);
    connssl->backend->ctx = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

static void ossl_close(struct ssl_connect_data *connssl)
{
  if(BACKEND->handle) {
    (void)SSL_shutdown(BACKEND->handle);
    SSL_set_connect_state(BACKEND->handle);

    SSL_free(BACKEND->handle);
    BACKEND->handle = NULL;
  }
  if(BACKEND->ctx) {
    SSL_CTX_free(BACKEND->ctx);
    BACKEND->ctx = NULL;
  }
}